

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O1

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,
                 monster_conflict *mon)

{
  mon_spell_info *pmVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  bool bVar6;
  _Bool _Var7;
  _Bool _Var8;
  uint flag;
  uint32_t uVar9;
  int iVar10;
  int flag_00;
  timed_failure *ptVar11;
  size_t size;
  bitflag *flags_00;
  monster_spell **ppmVar12;
  effect *peVar13;
  mon_spell_info *pmVar14;
  
  _Var7 = monster_is_smart((monster *)mon);
  iVar10 = 0x19;
  if (_Var7) {
    iVar10 = 0x32;
  }
  pmVar14 = mon_spell_types;
  flag = 0;
  do {
    ppmVar12 = &monster_spells;
    do {
      ppmVar12 = &((monster_spell *)ppmVar12)->next->next;
      if ((monster_spell *)ppmVar12 == (monster_spell *)0x0) goto LAB_00177aca;
    } while (((monster_spell *)ppmVar12)->index != (uint16_t)flag);
    if (((monster_spell *)ppmVar12 != (monster_spell *)0x0) &&
       (_Var8 = flag_has_dbg(spells,0xc,flag,"spells","info->index"), _Var8)) {
      peVar13 = ((monster_spell *)ppmVar12)->effect;
      if ((pmVar14->type & 7) == 0) {
        for (; peVar13 != (effect *)0x0; peVar13 = peVar13->next) {
          if (((_Var7) || (uVar9 = Rand_div(3), uVar9 != 0)) && (peVar13->index == 10)) {
            if (0x34 < (ulong)(uint)peVar13->subtype) {
              __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-spell.c"
                            ,0x1f8,
                            "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                           );
            }
            ptVar11 = timed_effects[(uint)peVar13->subtype].fail;
            if (ptVar11 != (timed_failure *)0x0) {
              bVar4 = false;
              bVar3 = false;
              do {
                bVar6 = bVar4;
                switch(ptVar11->code) {
                case 1:
                  flag_00 = ptVar11->idx;
                  size = 5;
                  pcVar5 = "save str flags";
                  flags_00 = flags;
                  goto LAB_00177b8e;
                case 2:
                  bVar3 = bVar4;
                  if (0 < el[ptVar11->idx].res_level) {
                    bVar3 = true;
                    bVar6 = true;
                  }
                  break;
                case 3:
                  bVar3 = bVar4;
                  if (el[ptVar11->idx].res_level < 0) {
                    bVar3 = true;
                    bVar6 = true;
                  }
                  break;
                case 4:
                  flag_00 = ptVar11->idx;
                  size = 3;
                  pcVar5 = "p->state.pflags";
                  flags_00 = pflags;
LAB_00177b8e:
                  _Var8 = flag_has_dbg(flags_00,size,flag_00,pcVar5 + 9,"f->idx");
                  bVar3 = true;
                  bVar6 = true;
                  if (!_Var8) {
                    bVar3 = bVar4;
                    bVar6 = bVar4;
                  }
                }
                bVar4 = bVar6;
                ptVar11 = ptVar11->next;
              } while ((ptVar11 != (timed_failure *)0x0) && (!bVar3));
              if (bVar3) goto LAB_00177ab9;
            }
          }
          if (((_Var7) || (uVar9 = Rand_div(2), uVar9 == 0)) &&
             ((peVar13->index == 0x17 &&
              (_Var8 = flag_has_dbg(pflags,3,10,"pflags","PF_NO_MANA"), _Var8)))) goto LAB_00177ab9;
        }
      }
      else {
        sVar2 = el[peVar13->subtype].res_level;
        uVar9 = Rand_div(100);
        if ((int)uVar9 < sVar2 * iVar10) {
LAB_00177ab9:
          flag_off(spells,0xc,flag);
        }
      }
    }
LAB_00177aca:
    pmVar1 = pmVar14 + 1;
    flag = (uint)pmVar1->index;
    pmVar14 = pmVar14 + 1;
    if (0x5b < pmVar1->index) {
      return;
    }
  } while( true );
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int learn_chance = el[element].res_level * (smart ? 50 : 25);
			if (randint0(100) < learn_chance) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level > 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level < 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}
}